

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O0

string * __thiscall
gl3cts::GPUShader5FloatEncodingTest::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,GPUShader5FloatEncodingTest *this,testCase *test_case)

{
  size_t local_48;
  size_t search_position;
  allocator<char> local_2a;
  undefined1 local_29;
  char *local_28;
  char *vs_body_template;
  testCase *test_case_local;
  GPUShader5FloatEncodingTest *this_local;
  string *vs_body;
  
  local_28 = 
  "#version 130\n#extension GL_ARB_gpu_shader5 : require\n\nuniform EXPECTED_VALUE_TYPE expected_value;\nuniform VALUE_TYPE value;\n\nout     vec4 result;\n\nvoid main()\n{\n    result = vec4(1.0, 1.0, 1.0, 1.0);\n\n    EXPECTED_VALUE_TYPE ret_val = TESTED_FUNCTION(value);\n\n    if (expected_value != ret_val)\n    {\n        result = vec4(0.0, 0.0, 0.0, 0.0);\n    }\n\n    switch (gl_VertexID)\n    {\n      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n    }\n}\n\n"
  ;
  local_29 = 0;
  vs_body_template = (char *)test_case;
  test_case_local = (testCase *)this;
  this_local = (GPUShader5FloatEncodingTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 130\n#extension GL_ARB_gpu_shader5 : require\n\nuniform EXPECTED_VALUE_TYPE expected_value;\nuniform VALUE_TYPE value;\n\nout     vec4 result;\n\nvoid main()\n{\n    result = vec4(1.0, 1.0, 1.0, 1.0);\n\n    EXPECTED_VALUE_TYPE ret_val = TESTED_FUNCTION(value);\n\n    if (expected_value != ret_val)\n    {\n        result = vec4(0.0, 0.0, 0.0, 0.0);\n    }\n\n    switch (gl_VertexID)\n    {\n      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n    }\n}\n\n"
             ,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  local_48 = 0;
  Utils::replaceToken("EXPECTED_VALUE_TYPE",&local_48,*(GLchar **)(vs_body_template + 8),
                      __return_storage_ptr__);
  Utils::replaceToken("VALUE_TYPE",&local_48,*(GLchar **)(vs_body_template + 0x20),
                      __return_storage_ptr__);
  Utils::replaceToken("EXPECTED_VALUE_TYPE",&local_48,*(GLchar **)(vs_body_template + 8),
                      __return_storage_ptr__);
  Utils::replaceToken("TESTED_FUNCTION",&local_48,*(GLchar **)(vs_body_template + 0x30),
                      __return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShader5FloatEncodingTest::getVertexShader(const testCase& test_case) const
{
	/* Vertex shader template */
	const char* vs_body_template = "#version 130\n"
								   "#extension GL_ARB_gpu_shader5 : require\n"
								   "\n"
								   "uniform EXPECTED_VALUE_TYPE expected_value;\n"
								   "uniform VALUE_TYPE value;\n"
								   "\n"
								   "out     vec4 result;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    result = vec4(1.0, 1.0, 1.0, 1.0);\n"
								   "\n"
								   "    EXPECTED_VALUE_TYPE ret_val = TESTED_FUNCTION(value);\n"
								   "\n"
								   "    if (expected_value != ret_val)\n"
								   "    {\n"
								   "        result = vec4(0.0, 0.0, 0.0, 0.0);\n"
								   "    }\n"
								   "\n"
								   "    switch (gl_VertexID)\n"
								   "    {\n"
								   "      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n"
								   "      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n"
								   "      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n"
								   "      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n"
								   "    }\n"
								   "}\n"
								   "\n";

	std::string vs_body = vs_body_template;

	/* Tokens */
	size_t search_position = 0;

	Utils::replaceToken("EXPECTED_VALUE_TYPE", search_position, test_case.m_expected_value.m_type_name, vs_body);
	Utils::replaceToken("VALUE_TYPE", search_position, test_case.m_value.m_type_name, vs_body);
	Utils::replaceToken("EXPECTED_VALUE_TYPE", search_position, test_case.m_expected_value.m_type_name, vs_body);
	Utils::replaceToken("TESTED_FUNCTION", search_position, test_case.m_function_name, vs_body);

	return vs_body;
}